

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O2

UnblindParameter * __thiscall
cfd::core::ConfidentialTxOut::Unblind
          (UnblindParameter *__return_storage_ptr__,ConfidentialTxOut *this,Privkey *blinding_key)

{
  CfdException *this_00;
  allocator local_39;
  string local_38;
  
  if (1 < (this->confidential_value_).version_) {
    ConfidentialTransaction::CalculateUnblindData
              (__return_storage_ptr__,&this->nonce_,blinding_key,&this->range_proof_,
               &this->confidential_value_,&(this->super_AbstractTxOut).locking_script_,&this->asset_
              );
    return __return_storage_ptr__;
  }
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)&local_38,"This output is not blinded.",&local_39);
  CfdException::CfdException(this_00,kCfdIllegalStateError,&local_38);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

bool ConfidentialValue::HasBlinding() const {
  return (version_ != 0) && (version_ != kConfidentialVersion_1);
}